

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

double __thiscall
BayesianGameIdenticalPayoff::ComputeValueJPol
          (BayesianGameIdenticalPayoff *this,JointPolicyDiscretePure *jpolBG)

{
  undefined4 uVar1;
  size_t sVar2;
  long *in_RSI;
  long *in_RDI;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double u;
  double p;
  Index jaI;
  Index jtI;
  double v;
  BayesianGameBase *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes(in_stack_ffffffffffffffd0);
    if (sVar2 <= local_1c) break;
    uVar1 = (**(code **)(*in_RSI + 0x88))(in_RSI,local_1c);
    uVar3 = (**(code **)(*in_RDI + 0x68))(in_RDI,local_1c);
    auVar4._0_8_ = (BayesianGameBase *)(**(code **)(*in_RDI + 0x80))(in_RDI,local_1c,uVar1);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar3;
    auVar4._8_8_ = 0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_18;
    auVar5 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
    local_18 = auVar5._0_8_;
    local_1c = local_1c + 1;
    in_stack_ffffffffffffffd0 = auVar4._0_8_;
  }
  return local_18;
}

Assistant:

double BayesianGameIdenticalPayoff::ComputeValueJPol(const JointPolicyDiscretePure & jpolBG) const
{
    double v=0.0;
    for(Index jtI=0; jtI<GetNrJointTypes(); jtI++)
    {
        Index jaI = jpolBG.GetJointActionIndex(jtI);
        double p = GetProbability(jtI);
        double u = GetUtility(jtI, jaI);
        v += p*u;
    }
    return(v);

}